

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O2

void __thiscall Shell::FunctionDefinitionExtra::output(FunctionDefinitionExtra *this,ostream *out)

{
  pointer ppTVar1;
  Term *this_00;
  bool bVar2;
  pointer ppTVar3;
  string local_50;
  
  std::operator<<(out,"inlined=[");
  ppTVar1 = (this->lhs).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (ppTVar3 = (this->lhs).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar1; ppTVar3 = ppTVar3 + 1
      ) {
    this_00 = *ppTVar3;
    if (!bVar2) {
      std::operator<<(out,",");
    }
    Kernel::Term::toString_abi_cxx11_(&local_50,this_00,true);
    std::operator<<(out,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = false;
  }
  std::operator<<(out,"]");
  return;
}

Assistant:

void FunctionDefinitionExtra::output(std::ostream &out) const {
  bool first = true;
  out << "inlined=[";
  for(Term *t : lhs) {
    if(!first)
      out << ",";
    first = false;
    out << t->toString();
  }
  out << "]";
}